

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_negate(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_negate::desc,0);
    __cxa_guard_release(&getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8)
  ;
  if (iVar1 == 0) {
    (**(code **)(*(long *)in_RDI + 0x130))(in_RDI,in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_negate(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* negate the value */
    neg_val(vmg_ retval, self);

    /* handled */
    return TRUE;
}